

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O0

bool __thiscall UnifiedRegex::RuntimeCharSet<char16_t>::Get(RuntimeCharSet<char16_t> *this,Char kc)

{
  uint uVar1;
  Char kc_local;
  RuntimeCharSet<char16_t> *this_local;
  
  uVar1 = Chars<char16_t>::CTU(kc);
  if (uVar1 < 0x100) {
    uVar1 = Chars<char16_t>::CTU(kc);
    this_local._7_1_ = CharBitvec::Get(&this->direct,uVar1);
  }
  else if (this->root == (CharSetNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = Chars<char16_t>::CTU(kc);
    this_local._7_1_ = Get_helper(this,uVar1);
  }
  return this_local._7_1_;
}

Assistant:

inline bool Get(Char kc) const
        {
            if (CTU(kc) < CharSetNode::directSize)
            {
                return direct.Get(CTU(kc));
            }
            else if (root == 0)
            {
                return false;
            }
            else
            {
                return Get_helper(CTU(kc));
            }
        }